

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall Imf_3_2::DeepScanLineInputFile::Data::~Data(Data *this)

{
  pointer ppLVar1;
  LineBuffer *pLVar2;
  pointer ppIVar3;
  size_t i;
  ulong uVar4;
  size_t i_1;
  
  uVar4 = 0;
  while( true ) {
    ppLVar1 = (this->lineBuffers).
              super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->lineBuffers).
                      super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar1 >> 3) <= uVar4)
    break;
    pLVar2 = ppLVar1[uVar4];
    if (pLVar2 != (LineBuffer *)0x0) {
      if (pLVar2->compressor != (Compressor *)0x0) {
        (*pLVar2->compressor->_vptr_Compressor[1])();
      }
      IlmThread_3_2::Semaphore::~Semaphore(&pLVar2->_sem);
      Array2D<unsigned_int>::~Array2D(&pLVar2->_tempCountBuffer);
      std::__cxx11::string::~string((string *)&pLVar2->exception);
      operator_delete(pLVar2,0xa0);
    }
    uVar4 = uVar4 + 1;
  }
  uVar4 = 0;
  while( true ) {
    ppIVar3 = (this->slices).
              super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->slices).
                      super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar3 >> 3) <= uVar4)
    break;
    operator_delete(ppIVar3[uVar4],0x48);
    uVar4 = uVar4 + 1;
  }
  if (this->sampleCountTableComp != (Compressor *)0x0) {
    (*this->sampleCountTableComp->_vptr_Compressor[1])();
  }
  if ((this->multiPartBackwardSupport == true) && (this->multiPartFile != (MultiPartInputFile *)0x0)
     ) {
    (*(this->multiPartFile->super_GenericInputFile)._vptr_GenericInputFile[1])();
  }
  Array<char>::~Array(&this->sampleCountTableBuffer);
  Array<bool>::~Array(&this->gotSampleCount);
  Array<unsigned_int>::~Array(&this->lineSampleCount);
  Array2D<unsigned_int>::~Array2D(&this->sampleCount);
  std::
  vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
  ::~vector(&this->lineBuffers);
  std::
  vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
  ::~vector(&this->slices);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->offsetInLineBuffer).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
  ;
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&this->frameBuffer);
  Header::~Header(&this->header);
  return;
}

Assistant:

DeepScanLineInputFile::Data::~Data ()
{
    for (size_t i = 0; i < lineBuffers.size (); i++)
        if (lineBuffers[i] != 0) delete lineBuffers[i];

    for (size_t i = 0; i < slices.size (); i++)
        delete slices[i];

    if (sampleCountTableComp != 0) delete sampleCountTableComp;

    if (multiPartBackwardSupport) delete multiPartFile;
}